

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.h
# Opt level: O0

void __thiscall SmallArray<InplaceStr,_8U>::~SmallArray(SmallArray<InplaceStr,_8U> *this)

{
  SmallArray<InplaceStr,_8U> *this_local;
  
  if (this->data != this->little) {
    if (this->allocator == (Allocator *)0x0) {
      NULLC::destruct<InplaceStr>(this->data,(ulong)this->max);
    }
    else {
      Allocator::destruct<InplaceStr>(this->allocator,this->data,(ulong)this->max);
    }
  }
  return;
}

Assistant:

~SmallArray()
	{
		if(data != little)
		{
			if(allocator)
				allocator->destruct(data, max);
			else
				NULLC::destruct(data, max);
		}
	}